

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::SectionStats::~SectionStats(SectionStats *this)

{
  pointer pcVar1;
  
  this->_vptr_SectionStats = (_func_int **)&PTR__SectionStats_0019fc30;
  pcVar1 = (this->sectionInfo).description._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->sectionInfo).description.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->sectionInfo).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->sectionInfo).name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

SectionStats::~SectionStats() = default;